

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

void imm_idx12_x_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  m680x_reg mVar5;
  long lVar6;
  uint8_t *extraout_RDX;
  uint8_t *puVar7;
  cs_m680x_op *op;
  
  bVar1 = (info->m680x).op_count;
  (info->m680x).op_count = bVar1 + 1;
  op = (info->m680x).operands + bVar1;
  indexed12_hdlr(MI,info,address);
  op->type = M680X_OP_IMMEDIATE;
  if (info->insn == M680X_INS_MOVW) {
    lVar6 = (ulong)*address - (ulong)info->offset;
    puVar7 = (uint8_t *)(lVar6 + 1);
    uVar4 = '\x02';
    uVar3 = '\x02';
    if ((uint)puVar7 < info->size) {
      bVar2 = info->code[(long)puVar7];
      puVar7 = (uint8_t *)(ulong)bVar2;
      mVar5 = (int)(short)((ushort)info->code[lVar6] << 8) | (uint)bVar2;
      goto LAB_0026e941;
    }
  }
  else {
    lVar6 = (ulong)*address - (ulong)info->offset;
    uVar4 = '\x01';
    puVar7 = extraout_RDX;
    uVar3 = '\x01';
    if ((uint)lVar6 < info->size) {
      puVar7 = info->code;
      mVar5 = (m680x_reg)(char)puVar7[lVar6];
      goto LAB_0026e941;
    }
  }
  uVar4 = uVar3;
  mVar5 = M680X_REG_INVALID;
LAB_0026e941:
  (info->m680x).operands[bVar1].field_1.reg = mVar5;
  (info->m680x).operands[bVar1].size = uVar4;
  set_operand_size(info,op,(uint8_t)puVar7);
  return;
}

Assistant:

static void imm_idx12_x_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];

	indexed12_hdlr(MI, info, address);
	op->type = M680X_OP_IMMEDIATE;

	if (info->insn == M680X_INS_MOVW) {
		uint16_t imm16 = 0;

		read_word(info, &imm16, *address);
		op->imm = (int16_t)imm16;
		op->size = 2;
	}
	else {
		uint8_t imm8 = 0;

		read_byte(info, &imm8, *address);
		op->imm = (int8_t)imm8;
		op->size = 1;
	}

	set_operand_size(info, op, 1);
}